

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O3

int __thiscall
ImPlotColormapData::Append(ImPlotColormapData *this,char *name,ImU32 *keys,int count,bool qual)

{
  int *piVar1;
  bool *__src;
  ImGuiID IVar2;
  int iVar3;
  int *piVar4;
  uint *puVar5;
  uint *puVar6;
  size_t sVar7;
  bool *__dest;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  
  IVar2 = ImHashStr(name,0,0);
  iVar12 = -1;
  iVar3 = ImGuiStorage::GetInt(&this->Map,IVar2,-1);
  if (iVar3 == -1) {
    iVar12 = (this->Keys).Size;
    iVar3 = (this->KeyOffsets).Size;
    if (iVar3 == (this->KeyOffsets).Capacity) {
      if (iVar3 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar3 / 2 + iVar3;
      }
      iVar11 = iVar3 + 1;
      if (iVar3 + 1 < iVar8) {
        iVar11 = iVar8;
      }
      piVar4 = (int *)ImGui::MemAlloc((long)iVar11 << 2);
      piVar1 = (this->KeyOffsets).Data;
      if (piVar1 != (int *)0x0) {
        memcpy(piVar4,piVar1,(long)(this->KeyOffsets).Size << 2);
        ImGui::MemFree((this->KeyOffsets).Data);
      }
      (this->KeyOffsets).Data = piVar4;
      (this->KeyOffsets).Capacity = iVar11;
      iVar3 = (this->KeyOffsets).Size;
    }
    else {
      piVar4 = (this->KeyOffsets).Data;
    }
    piVar4[iVar3] = iVar12;
    (this->KeyOffsets).Size = (this->KeyOffsets).Size + 1;
    iVar12 = (this->KeyCounts).Size;
    if (iVar12 == (this->KeyCounts).Capacity) {
      if (iVar12 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar12 / 2 + iVar12;
      }
      iVar8 = iVar12 + 1;
      if (iVar12 + 1 < iVar3) {
        iVar8 = iVar3;
      }
      piVar4 = (int *)ImGui::MemAlloc((long)iVar8 << 2);
      piVar1 = (this->KeyCounts).Data;
      if (piVar1 != (int *)0x0) {
        memcpy(piVar4,piVar1,(long)(this->KeyCounts).Size << 2);
        ImGui::MemFree((this->KeyCounts).Data);
      }
      (this->KeyCounts).Data = piVar4;
      (this->KeyCounts).Capacity = iVar8;
      iVar12 = (this->KeyCounts).Size;
    }
    else {
      piVar4 = (this->KeyCounts).Data;
    }
    piVar4[iVar12] = count;
    (this->KeyCounts).Size = (this->KeyCounts).Size + 1;
    lVar9 = (long)count + (long)(this->Keys).Size;
    iVar12 = (int)lVar9;
    if ((this->Keys).Capacity < iVar12) {
      puVar5 = (uint *)ImGui::MemAlloc(lVar9 * 4);
      puVar6 = (this->Keys).Data;
      if (puVar6 != (uint *)0x0) {
        memcpy(puVar5,puVar6,(long)(this->Keys).Size << 2);
        ImGui::MemFree((this->Keys).Data);
      }
      (this->Keys).Data = puVar5;
      (this->Keys).Capacity = iVar12;
    }
    if (0 < count) {
      iVar12 = (this->Keys).Size;
      uVar10 = 0;
      do {
        if (iVar12 == (this->Keys).Capacity) {
          if (iVar12 == 0) {
            iVar3 = 8;
          }
          else {
            iVar3 = iVar12 / 2 + iVar12;
          }
          iVar8 = iVar12 + 1;
          if (iVar12 + 1 < iVar3) {
            iVar8 = iVar3;
          }
          puVar6 = (uint *)ImGui::MemAlloc((long)iVar8 << 2);
          puVar5 = (this->Keys).Data;
          if (puVar5 != (uint *)0x0) {
            memcpy(puVar6,puVar5,(long)(this->Keys).Size << 2);
            ImGui::MemFree((this->Keys).Data);
          }
          (this->Keys).Data = puVar6;
          (this->Keys).Capacity = iVar8;
          iVar12 = (this->Keys).Size;
        }
        else {
          puVar6 = (this->Keys).Data;
        }
        puVar6[iVar12] = keys[uVar10];
        iVar12 = (this->Keys).Size + 1;
        (this->Keys).Size = iVar12;
        uVar10 = uVar10 + 1;
      } while ((uint)count != uVar10);
    }
    iVar12 = (this->Text).Buf.Size;
    iVar3 = (this->TextOffsets).Size;
    iVar8 = iVar12 + -1;
    if (iVar12 == 0) {
      iVar8 = 0;
    }
    if (iVar3 == (this->TextOffsets).Capacity) {
      if (iVar3 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar3 / 2 + iVar3;
      }
      iVar11 = iVar3 + 1;
      if (iVar3 + 1 < iVar12) {
        iVar11 = iVar12;
      }
      piVar4 = (int *)ImGui::MemAlloc((long)iVar11 << 2);
      piVar1 = (this->TextOffsets).Data;
      if (piVar1 != (int *)0x0) {
        memcpy(piVar4,piVar1,(long)(this->TextOffsets).Size << 2);
        ImGui::MemFree((this->TextOffsets).Data);
      }
      (this->TextOffsets).Data = piVar4;
      (this->TextOffsets).Capacity = iVar11;
      iVar3 = (this->TextOffsets).Size;
    }
    else {
      piVar4 = (this->TextOffsets).Data;
    }
    piVar4[iVar3] = iVar8;
    (this->TextOffsets).Size = (this->TextOffsets).Size + 1;
    sVar7 = strlen(name);
    ImGuiTextBuffer::append(&this->Text,name,name + sVar7 + 1);
    iVar12 = (this->Quals).Size;
    if (iVar12 == (this->Quals).Capacity) {
      if (iVar12 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar12 / 2 + iVar12;
      }
      iVar8 = iVar12 + 1;
      if (iVar12 + 1 < iVar3) {
        iVar8 = iVar3;
      }
      __dest = (bool *)ImGui::MemAlloc((long)iVar8);
      __src = (this->Quals).Data;
      if (__src != (bool *)0x0) {
        memcpy(__dest,__src,(long)(this->Quals).Size);
        ImGui::MemFree((this->Quals).Data);
      }
      (this->Quals).Data = __dest;
      (this->Quals).Capacity = iVar8;
      iVar12 = (this->Quals).Size;
    }
    else {
      __dest = (this->Quals).Data;
    }
    __dest[iVar12] = qual;
    (this->Quals).Size = (this->Quals).Size + 1;
    IVar2 = ImHashStr(name,0,0);
    iVar12 = this->Count;
    this->Count = iVar12 + 1;
    ImGuiStorage::SetInt(&this->Map,IVar2,iVar12);
    _AppendTable(this,iVar12);
  }
  return iVar12;
}

Assistant:

int Append(const char* name, const ImU32* keys, int count, bool qual) {
        if (GetIndex(name) != -1)
            return -1;
        KeyOffsets.push_back(Keys.size());
        KeyCounts.push_back(count);
        Keys.reserve(Keys.size()+count);
        for (int i = 0; i < count; ++i)
            Keys.push_back(keys[i]);
        TextOffsets.push_back(Text.size());
        Text.append(name, name + strlen(name) + 1);
        Quals.push_back(qual);
        ImGuiID id = ImHashStr(name);
        int idx = Count++;
        Map.SetInt(id,idx);
        _AppendTable(idx);
        return idx;
    }